

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O2

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_is_comma
          (quasiquote_conversion_visitor *this,cell *c)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  
  if (((*(int *)&(this->
                 super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>).
                 _vptr_base_visitor == 4) &&
      (pp_Var1 = this[5].
                 super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
                 _vptr_base_visitor,
      (long)this[6].super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
            _vptr_base_visitor - (long)pp_Var1 == 0xb0)) && (*(int *)pp_Var1 == 0)) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (pp_Var1 + 1),",");
    bVar3 = true;
    if (!bVar2) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (this[5].
                               super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>
                               ._vptr_base_visitor + 1),"unquote");
      return bVar3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool tag_is_comma(const cell& c)
      {
      if (c.type == ct_pair && c.pair.size() == 2)
        {
        return (c.pair[0].type == ct_symbol && ((c.pair[0].value == ",") || (c.pair[0].value == "unquote")));
        }
      return false;
      }